

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

AssertionResult * __thiscall
Catch::ResultBuilder::build(AssertionResult *__return_storage_ptr__,ResultBuilder *this)

{
  bool bVar1;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [64];
  OfType local_48;
  string local_40;
  
  if ((this->m_data).resultType != Unknown) {
    AssertionResultData::AssertionResultData((AssertionResultData *)local_88,&this->m_data);
    if ((this->m_exprComponents).testFalse == true) {
      if (local_48 == Ok) {
        local_48 = ExpressionFailed;
      }
      else if (local_48 == ExpressionFailed) {
        local_48 = Ok;
      }
    }
    std::__cxx11::stringbuf::str();
    this_00 = &local_40;
    std::__cxx11::string::operator=((string *)(local_88 + 0x20),(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    reconstructExpression_abi_cxx11_(&local_40,this);
    std::__cxx11::string::operator=((string *)local_88,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    if ((this->m_exprComponents).testFalse == true) {
      bVar1 = std::operator==(&(this->m_exprComponents).op,"");
      if (bVar1) {
        std::operator+(&local_40,"!",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
        std::__cxx11::string::operator=((string *)local_88,(string *)this_00);
      }
      else {
        std::operator+(&local_a8,"!(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
        std::operator+(&local_40,&local_a8,")");
        std::__cxx11::string::operator=((string *)local_88,(string *)this_00);
        std::__cxx11::string::~string((string *)this_00);
        this_00 = &local_a8;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    AssertionResult::AssertionResult
              (__return_storage_ptr__,&this->m_assertionInfo,(AssertionResultData *)local_88);
    AssertionResultData::~AssertionResultData((AssertionResultData *)local_88);
    return __return_storage_ptr__;
  }
  __assert_fail("m_data.resultType != ResultWas::Unknown",
                "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/tests/catch.hpp"
                ,0x2089,"AssertionResult Catch::ResultBuilder::build() const");
}

Assistant:

AssertionResult ResultBuilder::build() const
	{
		assert(m_data.resultType != ResultWas::Unknown);

		AssertionResultData data = m_data;

		// Flip bool results if testFalse is set
		if (m_exprComponents.testFalse) {
			if (data.resultType == ResultWas::Ok)
				data.resultType = ResultWas::ExpressionFailed;
			else if (data.resultType == ResultWas::ExpressionFailed)
				data.resultType = ResultWas::Ok;
		}

		data.message = m_stream.oss.str();
		data.reconstructedExpression = reconstructExpression();
		if (m_exprComponents.testFalse) {
			if (m_exprComponents.op == "")
				data.reconstructedExpression = "!" + data.reconstructedExpression;
			else
				data.reconstructedExpression = "!(" + data.reconstructedExpression + ")";
		}
		return AssertionResult(m_assertionInfo, data);
	}